

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O3

void __thiscall arangodb::velocypack::Builder::addDouble(Builder *this,double v)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  long lVar3;
  
  reserve(this,9);
  VVar2 = this->_pos;
  this->_pos = VVar2 + 1;
  this->_start[VVar2] = '\x1b';
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 1;
  lVar3 = -8;
  do {
    VVar2 = this->_pos;
    this->_pos = VVar2 + 1;
    this->_start[VVar2] = SUB81(v,0);
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
    v = (double)((ulong)v >> 8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  return;
}

Assistant:

void addDouble(double v) {
    uint64_t dv;
    ValueLength vSize = sizeof(double);
    memcpy(&dv, &v, vSize);
    reserve(1 + vSize);
    appendByteUnchecked(0x1b);
    for (uint64_t x = dv; vSize > 0; vSize--) {
      appendByteUnchecked(x & 0xff);
      x >>= 8;
    }
  }